

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

int blake2b_compress(blake2b_state *S,uint8_t *block)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint64_t v [16];
  uint64_t m [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  undefined8 local_178;
  undefined8 local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  long local_130;
  uint64_t local_108 [27];
  
  lVar12 = 0;
  do {
    uVar11 = load64(block + lVar12);
    *(uint64_t *)((long)local_108 + lVar12) = uVar11;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x80);
  uVar16 = S->h[0] + S->h[4] + local_108[0];
  uVar13 = S->t[0] ^ 0x510e527fade682d1 ^ uVar16;
  uVar14 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_178 = uVar14 + 0x6a09e667f3bcc908;
  uVar13 = S->h[4] ^ local_178;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar17 = uVar16 + local_108[1] + uVar13;
  uVar14 = uVar14 ^ uVar17;
  uVar15 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_178 = local_178 + uVar15;
  uVar13 = uVar13 ^ local_178;
  uVar16 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar20 = S->h[1] + S->h[5] + local_108[2];
  uVar13 = S->t[1] ^ 0x9b05688c2b3e6c1f ^ uVar20;
  uVar14 = uVar13 << 0x20 | uVar13 >> 0x20;
  local_170 = uVar14 + 0xbb67ae8584caa73b;
  uVar13 = S->h[5] ^ local_170;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar21 = uVar20 + local_108[3] + uVar13;
  uVar14 = uVar14 ^ uVar21;
  uVar19 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_170 = local_170 + uVar19;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar20 = S->h[2] + S->h[6] + local_108[4];
  uVar14 = S->f[0] ^ 0x1f83d9abfb41bd6b ^ uVar20;
  uVar24 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_168 = uVar24 + 0x3c6ef372fe94f82b;
  uVar14 = S->h[6] ^ local_168;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar18 = uVar20 + local_108[5] + uVar14;
  uVar24 = uVar24 ^ uVar18;
  uVar25 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_168 = local_168 + uVar25;
  uVar14 = uVar14 ^ local_168;
  uVar24 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar22 = S->h[3] + S->h[7] + local_108[6];
  uVar14 = S->f[1] ^ 0x5be0cd19137e2179 ^ uVar22;
  uVar20 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_160 = uVar20 + 0xa54ff53a5f1d36f1;
  uVar14 = S->h[7] ^ local_160;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar23 = uVar22 + local_108[7] + uVar14;
  uVar20 = uVar20 ^ uVar23;
  uVar22 = uVar20 << 0x30 | uVar20 >> 0x10;
  local_160 = local_160 + uVar22;
  uVar14 = uVar14 ^ local_160;
  uVar20 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar14 = uVar17 + local_108[8] + uVar13;
  uVar22 = uVar22 ^ uVar14;
  uVar22 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_168 = local_168 + uVar22;
  uVar13 = uVar13 ^ local_168;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar17 = uVar14 + local_108[9] + uVar13;
  uVar22 = uVar22 ^ uVar17;
  uVar22 = uVar22 << 0x30 | uVar22 >> 0x10;
  local_168 = local_168 + uVar22;
  uVar13 = uVar13 ^ local_168;
  uVar14 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar21 = uVar21 + local_108[10] + uVar24;
  uVar15 = uVar15 ^ uVar21;
  uVar13 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_160 = local_160 + uVar13;
  uVar24 = uVar24 ^ local_160;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar21 = uVar21 + local_108[0xb] + uVar24;
  uVar13 = uVar13 ^ uVar21;
  uVar15 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_160 = local_160 + uVar15;
  uVar24 = uVar24 ^ local_160;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar18 = uVar18 + local_108[0xc] + uVar20;
  uVar19 = uVar19 ^ uVar18;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_178 = local_178 + uVar19;
  uVar20 = uVar20 ^ local_178;
  uVar13 = uVar20 << 0x28 | uVar20 >> 0x18;
  uVar18 = uVar18 + local_108[0xd] + uVar13;
  uVar19 = uVar19 ^ uVar18;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_178 = local_178 + uVar19;
  uVar13 = uVar13 ^ local_178;
  uVar20 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar23 = uVar23 + local_108[0xe] + uVar16;
  uVar25 = uVar25 ^ uVar23;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_170 = local_170 + uVar25;
  uVar16 = uVar16 ^ local_170;
  uVar13 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar23 = uVar23 + local_108[0xf] + uVar13;
  uVar25 = uVar25 ^ uVar23;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_170 = local_170 + uVar25;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar17 = uVar17 + local_108[0xe] + uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar16 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar17 = uVar17 + local_108[10] + uVar13;
  uVar16 = uVar16 ^ uVar17;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar21 = uVar21 + local_108[4] + uVar14;
  uVar19 = uVar19 ^ uVar21;
  uVar15 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_170 = local_170 + uVar15;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar21 = uVar21 + local_108[8] + uVar14;
  uVar15 = uVar15 ^ uVar21;
  uVar19 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_170 = local_170 + uVar19;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar18 = uVar18 + local_108[9] + uVar24;
  uVar25 = uVar25 ^ uVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_168 = local_168 + uVar25;
  uVar24 = uVar24 ^ local_168;
  uVar15 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar18 = uVar18 + local_108[0xf] + uVar15;
  uVar25 = uVar25 ^ uVar18;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_168 = local_168 + uVar25;
  uVar15 = uVar15 ^ local_168;
  uVar24 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar23 = uVar23 + local_108[0xd] + uVar20;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_160 = local_160 + uVar22;
  uVar20 = uVar20 ^ local_160;
  uVar15 = uVar20 << 0x28 | uVar20 >> 0x18;
  uVar23 = uVar23 + local_108[6] + uVar15;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 << 0x30 | uVar22 >> 0x10;
  local_160 = local_160 + uVar22;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar20 = uVar17 + local_108[1] + uVar14;
  uVar22 = uVar22 ^ uVar20;
  uVar17 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_168 = local_168 + uVar17;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar20 = uVar20 + local_108[0xc] + uVar14;
  uVar17 = uVar17 ^ uVar20;
  uVar22 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_168 = local_168 + uVar22;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar21 = uVar21 + local_108[0] + uVar24;
  uVar16 = uVar16 ^ uVar21;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_160 = local_160 + uVar16;
  uVar24 = uVar24 ^ local_160;
  uVar17 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar21 = uVar21 + local_108[2] + uVar17;
  uVar16 = uVar16 ^ uVar21;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar24 = uVar18 + local_108[0xb] + uVar15;
  uVar19 = uVar19 ^ uVar24;
  uVar18 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_178 = local_178 + uVar18;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar24 = uVar24 + local_108[7] + uVar15;
  uVar18 = uVar18 ^ uVar24;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_178 = local_178 + uVar18;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar19 = uVar23 + local_108[5] + uVar13;
  uVar25 = uVar25 ^ uVar19;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_170 = local_170 + uVar25;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar23 = uVar19 + local_108[3] + uVar13;
  uVar25 = uVar25 ^ uVar23;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_170 = local_170 + uVar25;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar20 = uVar20 + local_108[0xb] + uVar13;
  uVar16 = uVar16 ^ uVar20;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar20 = uVar20 + local_108[8] + uVar13;
  uVar16 = uVar16 ^ uVar20;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar19 = uVar21 + local_108[0xc] + uVar14;
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_170 = local_170 + uVar18;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar21 = uVar19 + local_108[0] + uVar14;
  uVar18 = uVar18 ^ uVar21;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_170 = local_170 + uVar18;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar24 = uVar24 + local_108[5] + uVar17;
  uVar25 = uVar25 ^ uVar24;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_168 = local_168 + uVar19;
  uVar17 = uVar17 ^ local_168;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar24 = uVar24 + local_108[2] + uVar17;
  uVar19 = uVar19 ^ uVar24;
  uVar25 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_168 = local_168 + uVar25;
  uVar17 = uVar17 ^ local_168;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar23 = uVar23 + local_108[0xf] + uVar15;
  uVar22 = uVar22 ^ uVar23;
  uVar19 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_160 = local_160 + uVar19;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar23 = uVar23 + local_108[0xd] + uVar15;
  uVar19 = uVar19 ^ uVar23;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_160 = local_160 + uVar19;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar20 = uVar20 + local_108[10] + uVar14;
  uVar19 = uVar19 ^ uVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_168 = local_168 + uVar19;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar20 = uVar20 + local_108[0xe] + uVar14;
  uVar19 = uVar19 ^ uVar20;
  uVar22 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_168 = local_168 + uVar22;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar19 = uVar21 + local_108[3] + uVar17;
  uVar16 = uVar16 ^ uVar19;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar19 = uVar19 + local_108[6] + uVar17;
  uVar16 = uVar16 ^ uVar19;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar24 = uVar24 + local_108[7] + uVar15;
  uVar18 = uVar18 ^ uVar24;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_178 = local_178 + uVar18;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar24 = uVar24 + local_108[1] + uVar15;
  uVar18 = uVar18 ^ uVar24;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_178 = local_178 + uVar18;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar21 = uVar23 + local_108[9] + uVar13;
  uVar25 = uVar25 ^ uVar21;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_170 = local_170 + uVar25;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar23 = uVar21 + local_108[4] + uVar13;
  uVar25 = uVar25 ^ uVar23;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_170 = local_170 + uVar25;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar20 = uVar20 + local_108[7] + uVar13;
  uVar16 = uVar16 ^ uVar20;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar20 = uVar20 + local_108[9] + uVar13;
  uVar16 = uVar16 ^ uVar20;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar19 = uVar19 + local_108[3] + uVar14;
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_170 = local_170 + uVar18;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar21 = uVar19 + local_108[1] + uVar14;
  uVar18 = uVar18 ^ uVar21;
  uVar19 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_170 = local_170 + uVar19;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar24 = uVar24 + local_108[0xd] + uVar17;
  uVar25 = uVar25 ^ uVar24;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_168 = local_168 + uVar25;
  uVar17 = uVar17 ^ local_168;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar18 = uVar24 + local_108[0xc] + uVar17;
  uVar25 = uVar25 ^ uVar18;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_168 = local_168 + uVar25;
  uVar17 = uVar17 ^ local_168;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar23 = uVar23 + local_108[0xb] + uVar15;
  uVar22 = uVar22 ^ uVar23;
  uVar24 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_160 = local_160 + uVar24;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar23 = uVar23 + local_108[0xe] + uVar15;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_160 = local_160 + uVar24;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar20 = uVar20 + local_108[2] + uVar14;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_168 = local_168 + uVar24;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar20 = uVar20 + local_108[6] + uVar14;
  uVar24 = uVar24 ^ uVar20;
  uVar22 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_168 = local_168 + uVar22;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar24 = uVar21 + local_108[5] + uVar17;
  uVar16 = uVar16 ^ uVar24;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar21 = uVar24 + local_108[10] + uVar17;
  uVar16 = uVar16 ^ uVar21;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar24 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar17 = uVar18 + local_108[4] + uVar15;
  uVar19 = uVar19 ^ uVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_178 = local_178 + uVar19;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar18 = uVar17 + local_108[0] + uVar15;
  uVar19 = uVar19 ^ uVar18;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_178 = local_178 + uVar19;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar17 = uVar23 + local_108[0xf] + uVar13;
  uVar25 = uVar25 ^ uVar17;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_170 = local_170 + uVar25;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar23 = uVar17 + local_108[8] + uVar13;
  uVar25 = uVar25 ^ uVar23;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_170 = local_170 + uVar25;
  uVar13 = uVar13 ^ local_170;
  uVar17 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar20 = uVar20 + local_108[9] + uVar17;
  uVar16 = uVar16 ^ uVar20;
  uVar13 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar13;
  uVar17 = uVar17 ^ local_178;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar20 = uVar20 + local_108[0] + uVar17;
  uVar13 = uVar13 ^ uVar20;
  uVar16 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_178 = local_178 + uVar16;
  uVar17 = uVar17 ^ local_178;
  uVar13 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar21 = uVar21 + local_108[5] + uVar14;
  uVar19 = uVar19 ^ uVar21;
  uVar17 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_170 = local_170 + uVar17;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar21 = uVar21 + local_108[7] + uVar14;
  uVar17 = uVar17 ^ uVar21;
  uVar19 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_170 = local_170 + uVar19;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar18 = uVar18 + local_108[2] + uVar24;
  uVar25 = uVar25 ^ uVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_168 = local_168 + uVar25;
  uVar24 = uVar24 ^ local_168;
  uVar17 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar24 = uVar18 + local_108[4] + uVar17;
  uVar25 = uVar25 ^ uVar24;
  uVar26 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_168 = local_168 + uVar26;
  uVar17 = uVar17 ^ local_168;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar23 = uVar23 + local_108[10] + uVar15;
  uVar22 = uVar22 ^ uVar23;
  uVar18 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_160 = local_160 + uVar18;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar25 = uVar23 + local_108[0xf] + uVar15;
  uVar18 = uVar18 ^ uVar25;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_160 = local_160 + uVar18;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar20 = uVar20 + local_108[0xe] + uVar14;
  uVar18 = uVar18 ^ uVar20;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar20 = uVar20 + local_108[1] + uVar14;
  uVar18 = uVar18 ^ uVar20;
  uVar23 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_168 = local_168 + uVar23;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar18 = uVar21 + local_108[0xb] + uVar17;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar22 = uVar18 + local_108[0xc] + uVar17;
  uVar16 = uVar16 ^ uVar22;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar24 = uVar24 + local_108[6] + uVar15;
  uVar19 = uVar19 ^ uVar24;
  uVar18 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_178 = local_178 + uVar18;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar24 = uVar24 + local_108[8] + uVar15;
  uVar18 = uVar18 ^ uVar24;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_178 = local_178 + uVar18;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar19 = uVar25 + local_108[3] + uVar13;
  uVar26 = uVar26 ^ uVar19;
  uVar21 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_170 = local_170 + uVar21;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  local_130 = local_108[0xd];
  uVar26 = uVar19 + local_108[0xd] + uVar13;
  uVar21 = uVar21 ^ uVar26;
  uVar27 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_170 = local_170 + uVar27;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar20 = uVar20 + local_108[2] + uVar13;
  uVar16 = uVar16 ^ uVar20;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar20 = uVar20 + local_108[0xc] + uVar13;
  uVar16 = uVar16 ^ uVar20;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = local_178 + uVar16;
  uVar13 = uVar13 ^ local_178;
  uVar13 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar19 = uVar22 + local_108[6] + uVar14;
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_170 = local_170 + uVar18;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar25 = uVar19 + local_108[10] + uVar14;
  uVar18 = uVar18 ^ uVar25;
  uVar21 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_170 = local_170 + uVar21;
  uVar14 = uVar14 ^ local_170;
  uVar14 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar24 = uVar24 + local_108[0] + uVar17;
  uVar27 = uVar27 ^ uVar24;
  uVar18 = uVar27 << 0x20 | uVar27 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar17 = uVar17 ^ local_168;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar22 = uVar24 + uVar17 + local_108[0xb];
  uVar18 = uVar18 ^ uVar22;
  uVar28 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_168 = local_168 + uVar28;
  uVar17 = uVar17 ^ local_168;
  uVar19 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar24 = uVar26 + local_108[8] + uVar15;
  uVar23 = uVar23 ^ uVar24;
  uVar17 = uVar23 << 0x20 | uVar23 >> 0x20;
  local_160 = local_160 + uVar17;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar27 = uVar24 + local_108[3] + uVar15;
  uVar17 = uVar17 ^ uVar27;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_160 = local_160 + uVar17;
  uVar15 = uVar15 ^ local_160;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar20 = uVar20 + uVar14 + local_108[4];
  uVar17 = uVar17 ^ uVar20;
  uVar24 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_168 = local_168 + uVar24;
  uVar14 = uVar14 ^ local_168;
  uVar14 = uVar14 << 0x28 | uVar14 >> 0x18;
  uVar17 = uVar20 + local_108[0xd] + uVar14;
  uVar24 = uVar24 ^ uVar17;
  uVar18 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_168 = uVar18 + local_168;
  uVar14 = local_168 ^ uVar14;
  uVar24 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar20 = uVar25 + uVar19 + local_108[7];
  uVar16 = uVar16 ^ uVar20;
  uVar14 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_160 = local_160 + uVar14;
  uVar19 = uVar19 ^ local_160;
  uVar16 = uVar19 << 0x28 | uVar19 >> 0x18;
  uVar26 = uVar20 + local_108[5] + uVar16;
  uVar14 = uVar26 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_160 = uVar14 + local_160;
  uVar16 = local_160 ^ uVar16;
  uVar23 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar16 = uVar22 + uVar15 + local_108[0xf];
  uVar21 = uVar21 ^ uVar16;
  uVar20 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_178 = local_178 + uVar20;
  uVar15 = uVar15 ^ local_178;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar25 = uVar16 + local_108[0xe] + uVar15;
  uVar20 = uVar25 ^ uVar20;
  uVar16 = uVar20 << 0x30 | uVar20 >> 0x10;
  local_178 = uVar16 + local_178;
  uVar15 = uVar15 ^ local_178;
  uVar19 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar15 = uVar27 + local_108[1] + uVar13;
  uVar28 = uVar28 ^ uVar15;
  uVar20 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_170 = local_170 + uVar20;
  uVar13 = uVar13 ^ local_170;
  uVar13 = uVar13 << 0x28 | uVar13 >> 0x18;
  uVar28 = uVar15 + uVar13 + local_108[9];
  uVar20 = uVar28 ^ uVar20;
  uVar20 = uVar20 << 0x30 | uVar20 >> 0x10;
  local_170 = uVar20 + local_170;
  uVar13 = local_170 ^ uVar13;
  uVar22 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
  uVar15 = uVar17 + local_108[0xc] + uVar22;
  uVar14 = uVar14 ^ uVar15;
  uVar13 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_178 = local_178 + uVar13;
  uVar22 = uVar22 ^ local_178;
  uVar14 = uVar22 << 0x28 | uVar22 >> 0x18;
  uVar21 = uVar15 + uVar14 + local_108[5];
  uVar13 = uVar21 ^ uVar13;
  uVar22 = uVar13 << 0x30 | uVar13 >> 0x10;
  local_178 = uVar22 + local_178;
  uVar14 = local_178 ^ uVar14;
  uVar27 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
  uVar13 = uVar24 + uVar26 + local_108[1];
  uVar16 = uVar16 ^ uVar13;
  uVar14 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_170 = local_170 + uVar14;
  uVar24 = uVar24 ^ local_170;
  uVar16 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar13 = uVar13 + uVar16 + local_108[0xf];
  uVar14 = uVar13 ^ uVar14;
  uVar14 = uVar14 << 0x30 | uVar14 >> 0x10;
  local_170 = uVar14 + local_170;
  uVar16 = local_170 ^ uVar16;
  uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar15 = uVar23 + uVar25 + local_108[0xe];
  uVar20 = uVar20 ^ uVar15;
  uVar20 = uVar20 << 0x20 | uVar20 >> 0x20;
  local_168 = local_168 + uVar20;
  uVar23 = uVar23 ^ local_168;
  uVar17 = uVar23 << 0x28 | uVar23 >> 0x18;
  uVar15 = uVar15 + uVar17 + local_108[0xd];
  uVar20 = uVar15 ^ uVar20;
  uVar20 = uVar20 << 0x30 | uVar20 >> 0x10;
  local_168 = uVar20 + local_168;
  uVar17 = local_168 ^ uVar17;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar24 = uVar19 + uVar28 + local_108[4];
  uVar18 = uVar18 ^ uVar24;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_160 = local_160 + uVar18;
  uVar19 = uVar19 ^ local_160;
  uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
  uVar24 = uVar24 + uVar19 + local_108[10];
  uVar18 = uVar24 ^ uVar18;
  uVar18 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_160 = local_160 + uVar18;
  uVar19 = local_160 ^ uVar19;
  uVar26 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar19 = uVar16 + uVar21 + local_108[0];
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar16 = uVar16 ^ local_168;
  uVar16 = uVar16 << 0x28 | uVar16 >> 0x18;
  uVar21 = uVar19 + uVar16 + local_108[7];
  uVar18 = uVar21 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_168 = uVar25 + local_168;
  uVar16 = local_168 ^ uVar16;
  uVar23 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar13 = uVar17 + uVar13 + local_108[6];
  uVar22 = uVar22 ^ uVar13;
  uVar16 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_160 = local_160 + uVar16;
  uVar17 = uVar17 ^ local_160;
  uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar13 = uVar13 + uVar17 + local_108[3];
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_160 = uVar16 + local_160;
  uVar17 = local_160 ^ uVar17;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar15 = uVar26 + uVar15 + local_108[9];
  uVar14 = uVar14 ^ uVar15;
  uVar18 = uVar14 << 0x20 | uVar14 >> 0x20;
  local_178 = local_178 + uVar18;
  uVar26 = uVar26 ^ local_178;
  uVar19 = uVar26 << 0x28 | uVar26 >> 0x18;
  uVar14 = uVar15 + uVar19 + local_108[2];
  uVar18 = uVar14 ^ uVar18;
  uVar15 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_178 = uVar15 + local_178;
  uVar19 = local_178 ^ uVar19;
  uVar18 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar24 = uVar27 + uVar24 + local_108[8];
  uVar20 = uVar20 ^ uVar24;
  uVar19 = uVar20 << 0x20 | uVar20 >> 0x20;
  local_170 = local_170 + uVar19;
  uVar27 = uVar27 ^ local_170;
  uVar22 = uVar27 << 0x28 | uVar27 >> 0x18;
  uVar20 = uVar24 + uVar22 + local_108[0xb];
  uVar19 = uVar20 ^ uVar19;
  uVar24 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_170 = uVar24 + local_170;
  uVar22 = local_170 ^ uVar22;
  uVar19 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  uVar22 = uVar21 + uVar19 + local_108[0xd];
  uVar16 = uVar16 ^ uVar22;
  uVar21 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar21;
  uVar19 = uVar19 ^ local_178;
  uVar16 = uVar19 << 0x28 | uVar19 >> 0x18;
  uVar22 = uVar22 + uVar16 + local_108[0xb];
  uVar21 = uVar22 ^ uVar21;
  uVar26 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_178 = uVar26 + local_178;
  uVar16 = local_178 ^ uVar16;
  uVar21 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
  uVar13 = uVar23 + uVar13 + local_108[7];
  uVar15 = uVar15 ^ uVar13;
  uVar16 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_170 = local_170 + uVar16;
  uVar23 = uVar23 ^ local_170;
  uVar15 = uVar23 << 0x28 | uVar23 >> 0x18;
  uVar13 = uVar13 + uVar15 + local_108[0xe];
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_170 = uVar16 + local_170;
  uVar15 = local_170 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar14 = uVar17 + uVar14 + local_108[0xc];
  uVar24 = uVar24 ^ uVar14;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_168 = local_168 + uVar24;
  uVar17 = uVar17 ^ local_168;
  uVar19 = uVar17 << 0x28 | uVar17 >> 0x18;
  uVar14 = uVar14 + uVar19 + local_108[1];
  uVar24 = uVar14 ^ uVar24;
  uVar17 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_168 = uVar17 + local_168;
  uVar19 = local_168 ^ uVar19;
  uVar24 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar20 = uVar18 + uVar20 + local_108[3];
  uVar25 = uVar25 ^ uVar20;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_160 = local_160 + uVar19;
  uVar18 = uVar18 ^ local_160;
  uVar23 = uVar18 << 0x28 | uVar18 >> 0x18;
  uVar20 = uVar20 + uVar23 + local_108[9];
  uVar19 = uVar20 ^ uVar19;
  uVar18 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_160 = local_160 + uVar18;
  uVar23 = local_160 ^ uVar23;
  uVar27 = uVar23 << 1 | (ulong)((long)uVar23 < 0);
  uVar19 = uVar15 + uVar22 + local_108[5];
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar15 = uVar15 ^ local_168;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar22 = uVar19 + uVar15 + local_108[0];
  uVar18 = uVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_168 = uVar25 + local_168;
  uVar15 = local_168 ^ uVar15;
  uVar23 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar24 + uVar13 + local_108[0xf];
  uVar26 = uVar26 ^ uVar13;
  uVar15 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_160 = local_160 + uVar15;
  uVar24 = uVar24 ^ local_160;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar13 = uVar13 + uVar24 + local_108[4];
  uVar15 = uVar13 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_160 = uVar15 + local_160;
  uVar24 = local_160 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar14 = uVar27 + uVar14 + local_108[8];
  uVar16 = uVar16 ^ uVar14;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar27 = uVar27 ^ local_178;
  uVar18 = uVar27 << 0x28 | uVar27 >> 0x18;
  uVar14 = uVar14 + uVar18 + local_108[6];
  uVar16 = uVar14 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = uVar16 + local_178;
  uVar18 = local_178 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  uVar20 = uVar21 + uVar20 + local_108[2];
  uVar17 = uVar17 ^ uVar20;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_170 = local_170 + uVar17;
  uVar21 = uVar21 ^ local_170;
  uVar19 = uVar21 << 0x28 | uVar21 >> 0x18;
  uVar20 = uVar20 + uVar19 + local_108[10];
  uVar17 = uVar20 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_170 = uVar17 + local_170;
  uVar19 = local_170 ^ uVar19;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar22 = uVar22 + uVar19 + local_108[6];
  uVar15 = uVar15 ^ uVar22;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_178 = local_178 + uVar21;
  uVar19 = uVar19 ^ local_178;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  uVar22 = uVar22 + uVar15 + local_108[0xf];
  uVar21 = uVar22 ^ uVar21;
  uVar26 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_178 = uVar26 + local_178;
  uVar15 = local_178 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar23 + uVar13 + local_108[0xe];
  uVar16 = uVar16 ^ uVar13;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_170 = local_170 + uVar16;
  uVar23 = uVar23 ^ local_170;
  uVar15 = uVar23 << 0x28 | uVar23 >> 0x18;
  uVar13 = uVar13 + uVar15 + local_108[9];
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_170 = uVar16 + local_170;
  uVar15 = local_170 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar14 = uVar24 + uVar14 + local_108[0xb];
  uVar17 = uVar17 ^ uVar14;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_168 = local_168 + uVar17;
  uVar24 = uVar24 ^ local_168;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar14 = uVar14 + uVar24 + local_108[3];
  uVar17 = uVar14 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_168 = uVar17 + local_168;
  uVar24 = local_168 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar20 = uVar18 + uVar20 + local_108[0];
  uVar25 = uVar25 ^ uVar20;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_160 = local_160 + uVar19;
  uVar18 = uVar18 ^ local_160;
  uVar23 = uVar18 << 0x28 | uVar18 >> 0x18;
  uVar20 = uVar20 + uVar23 + local_108[8];
  uVar19 = uVar20 ^ uVar19;
  uVar18 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_160 = local_160 + uVar18;
  uVar23 = local_160 ^ uVar23;
  uVar27 = uVar23 << 1 | (ulong)((long)uVar23 < 0);
  uVar19 = uVar15 + uVar22 + local_108[0xc];
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar15 = uVar15 ^ local_168;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar22 = uVar19 + uVar15 + local_108[2];
  uVar18 = uVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_168 = uVar25 + local_168;
  uVar15 = local_168 ^ uVar15;
  uVar23 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar24 + uVar13 + local_108[0xd];
  uVar26 = uVar26 ^ uVar13;
  uVar15 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_160 = local_160 + uVar15;
  uVar24 = uVar24 ^ local_160;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar13 = uVar13 + uVar24 + local_108[7];
  uVar15 = uVar13 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_160 = uVar15 + local_160;
  uVar24 = local_160 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar14 = uVar27 + uVar14 + local_108[1];
  uVar16 = uVar16 ^ uVar14;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar27 = uVar27 ^ local_178;
  uVar18 = uVar27 << 0x28 | uVar27 >> 0x18;
  uVar14 = uVar14 + uVar18 + local_108[4];
  uVar16 = uVar14 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = uVar16 + local_178;
  uVar18 = local_178 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  uVar20 = uVar21 + uVar20 + local_108[10];
  uVar17 = uVar17 ^ uVar20;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_170 = local_170 + uVar17;
  uVar21 = uVar21 ^ local_170;
  uVar19 = uVar21 << 0x28 | uVar21 >> 0x18;
  uVar20 = uVar20 + uVar19 + local_108[5];
  uVar17 = uVar20 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_170 = uVar17 + local_170;
  uVar19 = local_170 ^ uVar19;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar22 = uVar22 + uVar19 + local_108[10];
  uVar15 = uVar15 ^ uVar22;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_178 = local_178 + uVar21;
  uVar19 = uVar19 ^ local_178;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  uVar22 = uVar22 + uVar15 + local_108[2];
  uVar21 = uVar22 ^ uVar21;
  uVar26 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_178 = uVar26 + local_178;
  uVar15 = local_178 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar23 + uVar13 + local_108[8];
  uVar16 = uVar16 ^ uVar13;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_170 = local_170 + uVar16;
  uVar23 = uVar23 ^ local_170;
  uVar15 = uVar23 << 0x28 | uVar23 >> 0x18;
  uVar13 = uVar13 + uVar15 + local_108[4];
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_170 = uVar16 + local_170;
  uVar15 = local_170 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar14 = uVar24 + uVar14 + local_108[7];
  uVar17 = uVar17 ^ uVar14;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_168 = local_168 + uVar17;
  uVar24 = uVar24 ^ local_168;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar14 = uVar14 + uVar24 + local_108[6];
  uVar17 = uVar14 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_168 = uVar17 + local_168;
  uVar24 = local_168 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar20 = uVar18 + uVar20 + local_108[1];
  uVar25 = uVar25 ^ uVar20;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_160 = local_160 + uVar19;
  uVar18 = uVar18 ^ local_160;
  uVar23 = uVar18 << 0x28 | uVar18 >> 0x18;
  uVar20 = uVar20 + uVar23 + local_108[5];
  uVar19 = uVar20 ^ uVar19;
  uVar18 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_160 = local_160 + uVar18;
  uVar23 = local_160 ^ uVar23;
  uVar27 = uVar23 << 1 | (ulong)((long)uVar23 < 0);
  uVar19 = uVar15 + uVar22 + local_108[0xf];
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar15 = uVar15 ^ local_168;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar22 = uVar19 + uVar15 + local_108[0xb];
  uVar18 = uVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_168 = uVar25 + local_168;
  uVar15 = local_168 ^ uVar15;
  uVar23 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar24 + uVar13 + local_108[9];
  uVar26 = uVar26 ^ uVar13;
  uVar15 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_160 = local_160 + uVar15;
  uVar24 = uVar24 ^ local_160;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar13 = uVar13 + uVar24 + local_108[0xe];
  uVar15 = uVar13 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_160 = uVar15 + local_160;
  uVar24 = local_160 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar14 = uVar27 + uVar14 + local_108[3];
  uVar16 = uVar16 ^ uVar14;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar27 = uVar27 ^ local_178;
  uVar18 = uVar27 << 0x28 | uVar27 >> 0x18;
  uVar14 = uVar14 + uVar18 + local_108[0xc];
  uVar16 = uVar14 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = uVar16 + local_178;
  uVar18 = local_178 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  uVar20 = uVar21 + uVar20 + local_108[0xd];
  uVar17 = uVar17 ^ uVar20;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_170 = local_170 + uVar17;
  uVar21 = uVar21 ^ local_170;
  uVar19 = uVar21 << 0x28 | uVar21 >> 0x18;
  uVar20 = uVar20 + uVar19 + local_108[0];
  uVar17 = uVar20 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_170 = uVar17 + local_170;
  uVar19 = local_170 ^ uVar19;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar22 = uVar22 + uVar19 + local_108[0];
  uVar15 = uVar15 ^ uVar22;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_178 = local_178 + uVar21;
  uVar19 = uVar19 ^ local_178;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  uVar22 = uVar22 + uVar15 + local_108[1];
  uVar21 = uVar22 ^ uVar21;
  uVar26 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_178 = uVar26 + local_178;
  uVar15 = local_178 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar23 + uVar13 + local_108[2];
  uVar16 = uVar16 ^ uVar13;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_170 = local_170 + uVar16;
  uVar23 = uVar23 ^ local_170;
  uVar15 = uVar23 << 0x28 | uVar23 >> 0x18;
  uVar13 = uVar13 + uVar15 + local_108[3];
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_170 = uVar16 + local_170;
  uVar15 = local_170 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar14 = uVar24 + uVar14 + local_108[4];
  uVar17 = uVar17 ^ uVar14;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_168 = local_168 + uVar17;
  uVar24 = uVar24 ^ local_168;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar14 = uVar14 + uVar24 + local_108[5];
  uVar17 = uVar14 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_168 = uVar17 + local_168;
  uVar24 = local_168 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar20 = uVar18 + uVar20 + local_108[6];
  uVar25 = uVar25 ^ uVar20;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_160 = local_160 + uVar19;
  uVar18 = uVar18 ^ local_160;
  uVar23 = uVar18 << 0x28 | uVar18 >> 0x18;
  uVar20 = uVar20 + uVar23 + local_108[7];
  uVar19 = uVar20 ^ uVar19;
  uVar18 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_160 = local_160 + uVar18;
  uVar23 = local_160 ^ uVar23;
  uVar27 = uVar23 << 1 | (ulong)((long)uVar23 < 0);
  uVar19 = uVar15 + uVar22 + local_108[8];
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar15 = uVar15 ^ local_168;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  uVar22 = uVar19 + uVar15 + local_108[9];
  uVar18 = uVar22 ^ uVar18;
  uVar25 = uVar18 << 0x30 | uVar18 >> 0x10;
  local_168 = uVar25 + local_168;
  uVar15 = local_168 ^ uVar15;
  uVar23 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar24 + uVar13 + local_108[10];
  uVar26 = uVar26 ^ uVar13;
  uVar15 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_160 = local_160 + uVar15;
  uVar24 = uVar24 ^ local_160;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar13 = uVar13 + uVar24 + local_108[0xb];
  uVar15 = uVar13 ^ uVar15;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  local_160 = uVar15 + local_160;
  uVar24 = local_160 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar14 = uVar27 + uVar14 + local_108[0xc];
  uVar16 = uVar16 ^ uVar14;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar16;
  uVar27 = uVar27 ^ local_178;
  uVar18 = uVar27 << 0x28 | uVar27 >> 0x18;
  uVar14 = uVar14 + uVar18 + local_108[0xd];
  uVar16 = uVar14 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_178 = uVar16 + local_178;
  uVar18 = local_178 ^ uVar18;
  uVar18 = uVar18 << 1 | (ulong)((long)uVar18 < 0);
  uVar20 = uVar21 + uVar20 + local_108[0xe];
  uVar17 = uVar17 ^ uVar20;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_170 = local_170 + uVar17;
  uVar21 = uVar21 ^ local_170;
  uVar19 = uVar21 << 0x28 | uVar21 >> 0x18;
  uVar20 = uVar20 + uVar19 + local_108[0xf];
  uVar17 = uVar20 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_170 = uVar17 + local_170;
  uVar19 = local_170 ^ uVar19;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar22 = uVar22 + uVar19 + local_108[0xe];
  uVar15 = uVar15 ^ uVar22;
  uVar21 = uVar15 << 0x20 | uVar15 >> 0x20;
  local_178 = local_178 + uVar21;
  uVar19 = uVar19 ^ local_178;
  uVar15 = uVar19 << 0x28 | uVar19 >> 0x18;
  uVar22 = uVar22 + uVar15 + local_108[10];
  uVar21 = uVar22 ^ uVar21;
  uVar26 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_178 = uVar26 + local_178;
  uVar15 = local_178 ^ uVar15;
  uVar21 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar13 = uVar23 + uVar13 + local_108[4];
  uVar16 = uVar16 ^ uVar13;
  uVar16 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_170 = local_170 + uVar16;
  uVar23 = uVar23 ^ local_170;
  uVar15 = uVar23 << 0x28 | uVar23 >> 0x18;
  uVar13 = uVar13 + uVar15 + local_108[8];
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x30 | uVar16 >> 0x10;
  local_170 = uVar16 + local_170;
  uVar15 = local_170 ^ uVar15;
  uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar14 = uVar24 + uVar14 + local_108[9];
  uVar17 = uVar17 ^ uVar14;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_168 = local_168 + uVar17;
  uVar24 = uVar24 ^ local_168;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uVar14 = uVar14 + uVar24 + local_108[0xf];
  uVar17 = uVar14 ^ uVar17;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  local_168 = uVar17 + local_168;
  uVar24 = local_168 ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar20 = uVar18 + uVar20 + local_108[0xd];
  uVar25 = uVar25 ^ uVar20;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_160 = local_160 + uVar19;
  uVar18 = uVar18 ^ local_160;
  uVar23 = uVar18 << 0x28 | uVar18 >> 0x18;
  uVar20 = uVar20 + uVar23 + local_108[6];
  uVar19 = uVar20 ^ uVar19;
  uVar18 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_160 = local_160 + uVar18;
  uVar23 = local_160 ^ uVar23;
  uVar23 = uVar23 << 1 | (ulong)((long)uVar23 < 0);
  uVar19 = uVar15 + uVar22 + local_108[1];
  uVar18 = uVar18 ^ uVar19;
  uVar18 = uVar18 << 0x20 | uVar18 >> 0x20;
  local_168 = local_168 + uVar18;
  uVar15 = uVar15 ^ local_168;
  uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
  local_1b8 = uVar19 + uVar15 + local_108[0xc];
  local_1b8 = local_1b8 ^ uVar18;
  local_140 = local_1b8 << 0x30 | local_1b8 >> 0x10;
  local_168 = local_140 + local_168;
  local_168 = local_168 ^ uVar15;
  uStack_190 = local_168 << 1 | (ulong)((long)local_168 < 0);
  uVar13 = uVar24 + uVar13 + local_108[0];
  uVar26 = uVar26 ^ uVar13;
  uVar15 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_160 = local_160 + uVar15;
  uVar24 = uVar24 ^ local_160;
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  uStack_1b0 = uVar13 + uVar24 + local_108[2];
  uStack_1b0 = uStack_1b0 ^ uVar15;
  local_158 = uStack_1b0 << 0x30 | uStack_1b0 >> 0x10;
  local_160 = local_158 + local_160;
  local_160 = local_160 ^ uVar24;
  local_188 = local_160 << 1 | (ulong)((long)local_160 < 0);
  uVar13 = uVar23 + uVar14 + local_108[0xb];
  uVar16 = uVar16 ^ uVar13;
  uVar14 = uVar16 << 0x20 | uVar16 >> 0x20;
  local_178 = local_178 + uVar14;
  uVar23 = uVar23 ^ local_178;
  uVar16 = uVar23 << 0x28 | uVar23 >> 0x18;
  local_1a8 = uVar13 + uVar16 + local_108[7];
  local_1a8 = local_1a8 ^ uVar14;
  local_150 = local_1a8 << 0x30 | local_1a8 >> 0x10;
  local_178 = local_150 + local_178;
  local_178 = local_178 ^ uVar16;
  uStack_180 = local_178 << 1 | (ulong)((long)local_178 < 0);
  uVar13 = uVar21 + uVar20 + local_108[5];
  uVar17 = uVar17 ^ uVar13;
  uVar14 = uVar17 << 0x20 | uVar17 >> 0x20;
  local_170 = local_170 + uVar14;
  uVar21 = uVar21 ^ local_170;
  uVar16 = uVar21 << 0x28 | uVar21 >> 0x18;
  uStack_1a0 = uVar13 + uVar16 + local_108[3];
  uStack_1a0 = uStack_1a0 ^ uVar14;
  local_148 = uStack_1a0 << 0x30 | uStack_1a0 >> 0x10;
  local_170 = local_148 + local_170;
  local_170 = local_170 ^ uVar16;
  local_198 = local_170 << 1 | (ulong)((long)local_170 < 0);
  lVar12 = 0;
  do {
    puVar1 = S->h + lVar12;
    uVar3 = *(uint *)((long)puVar1 + 4);
    uVar11 = puVar1[1];
    uVar4 = *(uint *)((long)puVar1 + 0xc);
    uVar5 = *(uint *)((long)&local_1b8 + lVar12 * 8 + 4);
    uVar6 = *(uint *)(&uStack_1b0 + lVar12);
    uVar7 = *(uint *)((long)&uStack_1b0 + lVar12 * 8 + 4);
    uVar8 = *(uint *)((long)&local_178 + lVar12 * 8 + 4);
    uVar9 = *(uint *)(&local_170 + lVar12);
    uVar10 = *(uint *)((long)&local_170 + lVar12 * 8 + 4);
    puVar2 = S->h + lVar12;
    *(uint *)puVar2 =
         (uint)*puVar1 ^ *(uint *)(&local_1b8 + lVar12) ^ *(uint *)(&local_178 + lVar12);
    *(uint *)((long)puVar2 + 4) = uVar3 ^ uVar5 ^ uVar8;
    *(uint *)(puVar2 + 1) = (uint)uVar11 ^ uVar6 ^ uVar9;
    *(uint *)((long)puVar2 + 0xc) = uVar4 ^ uVar7 ^ uVar10;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 8);
  return 8;
}

Assistant:

static int blake2b_compress( blake2b_state *S, const uint8_t block[BLAKE2B_BLOCKBYTES] )
{
  uint64_t m[16];
  uint64_t v[16];
  int i;

  for( i = 0; i < 16; ++i )
    m[i] = load64( block + i * sizeof( m[i] ) );

  for( i = 0; i < 8; ++i )
    v[i] = S->h[i];

  v[ 8] = blake2b_IV[0];
  v[ 9] = blake2b_IV[1];
  v[10] = blake2b_IV[2];
  v[11] = blake2b_IV[3];
  v[12] = S->t[0] ^ blake2b_IV[4];
  v[13] = S->t[1] ^ blake2b_IV[5];
  v[14] = S->f[0] ^ blake2b_IV[6];
  v[15] = S->f[1] ^ blake2b_IV[7];
#define G(r,i,a,b,c,d) \
  do { \
    a = a + b + m[blake2b_sigma[r][2*i+0]]; \
    d = rotr64(d ^ a, 32); \
    c = c + d; \
    b = rotr64(b ^ c, 24); \
    a = a + b + m[blake2b_sigma[r][2*i+1]]; \
    d = rotr64(d ^ a, 16); \
    c = c + d; \
    b = rotr64(b ^ c, 63); \
  } while(0)
#define ROUND(r)  \
  do { \
    G(r,0,v[ 0],v[ 4],v[ 8],v[12]); \
    G(r,1,v[ 1],v[ 5],v[ 9],v[13]); \
    G(r,2,v[ 2],v[ 6],v[10],v[14]); \
    G(r,3,v[ 3],v[ 7],v[11],v[15]); \
    G(r,4,v[ 0],v[ 5],v[10],v[15]); \
    G(r,5,v[ 1],v[ 6],v[11],v[12]); \
    G(r,6,v[ 2],v[ 7],v[ 8],v[13]); \
    G(r,7,v[ 3],v[ 4],v[ 9],v[14]); \
  } while(0)
  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );
  ROUND( 10 );
  ROUND( 11 );

  for( i = 0; i < 8; ++i )
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];

#undef G
#undef ROUND
  return 0;
}